

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-msg.c
# Opt level: O2

_Bool redundant_monster_message(monster_conflict *mon,wchar_t msg_code)

{
  ulong uVar1;
  ulong uVar2;
  wchar_t *pwVar3;
  
  if (mon != (monster_conflict *)0x0) {
    uVar1 = 0;
    uVar2 = 0;
    if (L'\0' < size_mon_hist) {
      uVar2 = (ulong)(uint)size_mon_hist;
    }
    for (pwVar3 = &mon_message_hist[0].message_code;
        (uVar2 != uVar1 &&
        ((((monster_message_history *)(pwVar3 + -2))->mon != mon || (*pwVar3 != msg_code))));
        pwVar3 = pwVar3 + 4) {
      uVar1 = uVar1 + 1;
    }
    return (long)uVar1 < (long)size_mon_hist;
  }
  __assert_fail("mon",
                "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/mon-msg.c"
                ,0x96,"_Bool redundant_monster_message(struct monster *, int)");
}

Assistant:

static bool redundant_monster_message(struct monster *mon, int msg_code)
{
	assert(mon);
	assert(msg_code >= 0);
	assert(msg_code < MON_MSG_MAX);

	for (int i = 0; i < size_mon_hist; i++) {
		/* Check for a matched monster & monster code */
		if (mon == mon_message_hist[i].mon &&
				msg_code == mon_message_hist[i].message_code) {
			return true;
		}
	}

	return false;
}